

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O3

string * toString(string *__return_storage_ptr__,ArgInfo *argInfo,string *indent)

{
  ostream *poVar1;
  long *plVar2;
  ulong uVar3;
  long *plVar4;
  string replace;
  string desc;
  string name;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  char *local_200;
  long local_1f8;
  char local_1f0 [16];
  char *local_1e0;
  long local_1d8;
  char local_1d0 [16];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,*(long *)(argInfo + 0x40),
             *(long *)(argInfo + 0x48) + *(long *)(argInfo + 0x40));
  if (*(long *)(argInfo + 0x48) == 0) {
    std::__cxx11::string::_M_assign((string *)&local_1e0);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," * ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1e0,local_1d8);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,*(long *)(argInfo + 0x60),
             *(long *)(argInfo + 0x68) + *(long *)(argInfo + 0x60));
  std::operator+(&local_240,"\n",indent);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_220 = &local_210;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_210 = *plVar4;
    lStack_208 = plVar2[3];
  }
  else {
    local_210 = *plVar4;
    local_220 = (long *)*plVar2;
  }
  local_218 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_1c0 = indent;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  uVar3 = std::__cxx11::string::find((char *)&local_200,0x10d59a,0);
  if (uVar3 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)&local_200,uVar3,(char *)0x1,(ulong)local_220);
      uVar3 = std::__cxx11::string::find((char *)&local_200,0x10d59a,uVar3 + local_218);
    } while (uVar3 != 0xffffffffffffffff);
  }
  if (local_1f8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," - ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_200,local_1f8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(local_1c0->_M_dataplus)._M_p,local_1c0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [key=",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,*(char **)argInfo,*(long *)(argInfo + 8));
  if (*(long *)(argInfo + 0x88) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", units=",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)(argInfo + 0x80),*(long *)(argInfo + 0x88));
  }
  if (*(long *)(argInfo + 0x28) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", default=",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)(argInfo + 0x20),*(long *)(argInfo + 0x28));
  }
  uVar3 = (ulong)*(uint *)(argInfo + 0xa0);
  if (uVar3 < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,&DAT_0010d830 + *(int *)(&DAT_0010d830 + uVar3 * 4),
               *(long *)(&DAT_0010d840 + uVar3 * 8));
  }
  if (*(double *)(argInfo + 0xa8) <= *(double *)(argInfo + 0xb0) &&
      *(double *)(argInfo + 0xb0) != *(double *)(argInfo + 0xa8)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", range=",8);
    toString_abi_cxx11_(&local_240,(Range *)(argInfo + 0xa8));
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
  }
  if (*(long *)(argInfo + 0xc0) != *(long *)(argInfo + 200)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", options=(",0xb);
    toString<std::__cxx11::string>
              (&local_240,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(argInfo + 0xc0));
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const SoapySDR::ArgInfo &argInfo, const std::string indent = "    ")
{
    std::stringstream ss;

    //name, or use key if missing
    std::string name = argInfo.name;
    if (argInfo.name.empty()) name = argInfo.key;
    ss << indent << " * " << name;

    //optional description
    std::string desc = argInfo.description;
    const std::string replace("\n"+indent+"   ");
    for (size_t pos = 0; (pos=desc.find("\n", pos)) != std::string::npos; pos+=replace.size())
    {
        desc.replace(pos, 1, replace);
    }
    if (not desc.empty()) ss << " - " << desc << std::endl << indent << "  ";

    //other fields
    ss << " [key=" << argInfo.key;
    if (not argInfo.units.empty()) ss << ", units=" << argInfo.units;
    if (not argInfo.value.empty()) ss << ", default=" << argInfo.value;

    //type
    switch (argInfo.type)
    {
    case SoapySDR::ArgInfo::BOOL: ss << ", type=bool"; break;
    case SoapySDR::ArgInfo::INT: ss << ", type=int"; break;
    case SoapySDR::ArgInfo::FLOAT: ss << ", type=float"; break;
    case SoapySDR::ArgInfo::STRING: ss << ", type=string"; break;
    }

    //optional range/enumeration
    if (argInfo.range.minimum() < argInfo.range.maximum()) ss << ", range=" << toString(argInfo.range);
    if (not argInfo.options.empty()) ss << ", options=(" << toString(argInfo.options) << ")";

    ss << "]";

    return ss.str();
}